

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::GenericPackage::Copy(GenericPackage *this,GenericPackage *rhs)

{
  GenericPackage *rhs_local;
  GenericPackage *this_local;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  UMID::operator=(&this->PackageUID,&rhs->PackageUID);
  optional_property<ASDCP::MXF::UTF16String>::operator=(&this->Name,&rhs->Name);
  Kumu::Timestamp::operator=(&this->PackageCreationDate,&rhs->PackageCreationDate);
  Kumu::Timestamp::operator=(&this->PackageModifiedDate,&rhs->PackageModifiedDate);
  Array<Kumu::UUID>::operator=(&this->Tracks,&rhs->Tracks);
  return;
}

Assistant:

void
GenericPackage::Copy(const GenericPackage& rhs)
{
  InterchangeObject::Copy(rhs);
  PackageUID = rhs.PackageUID;
  Name = rhs.Name;
  PackageCreationDate = rhs.PackageCreationDate;
  PackageModifiedDate = rhs.PackageModifiedDate;
  Tracks = rhs.Tracks;
}